

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O3

bool __thiscall VPPOperator::Prepare(VPPOperator *this,RunContext *ctx)

{
  pointer pcVar1;
  pointer pCVar2;
  Connection *pCVar3;
  undefined8 uVar4;
  pointer pCVar5;
  Block *b;
  long *plVar6;
  CommandBlock *b_00;
  Connection *c;
  pointer pCVar7;
  long *plVar8;
  Connection *c_1;
  Pipeline *pPVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  string fifoname;
  string fifo;
  string command;
  vector<Connection_*,_std::allocator<Connection_*>_> outputs;
  string from;
  string to2;
  string to;
  undefined1 local_1e0 [32];
  RunContext *local_1c0;
  string local_1b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  long local_190;
  char local_188 [16];
  Connection **local_178;
  iterator iStack_170;
  Connection **local_168;
  Pipeline *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_108 [16];
  long *local_f8;
  long local_f0;
  long local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  ulong local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_198._M_current = local_188;
  pcVar1 = (this->command)._M_dataplus._M_p;
  local_1c0 = ctx;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar1,pcVar1 + (this->command)._M_string_length);
  if (0 < this->ninputs) {
    uVar13 = 0;
    do {
      pCVar7 = (this->super_BaseNode).connections.
               super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar2 = (this->super_BaseNode).connections.
               super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pCVar7 == pCVar2) {
LAB_00154fd7:
        bVar10 = false;
        printf("input slot %d not connected?\n",uVar13 & 0xffffffff);
        goto LAB_0015500e;
      }
      pCVar5 = (pointer)0x0;
      do {
        if (((VPPOperator *)pCVar7->input_node == this) &&
           (pCVar7->input_slot == PipeInputSlotNames[uVar13])) {
          pCVar5 = pCVar7;
        }
        pCVar7 = pCVar7 + 1;
      } while (pCVar7 != pCVar2);
      if (pCVar5 == (pointer)0x0) goto LAB_00154fd7;
      RunContext::MakeOrGetFifo_abi_cxx11_
                ((string *)local_1e0,local_1c0,pCVar5->input_node,pCVar5->input_slot,
                 pCVar5->output_node,pCVar5->output_slot);
      pPVar9 = (Pipeline *)local_1e0._8_8_;
      if ((Pipeline *)local_1e0._8_8_ == (Pipeline *)0x0) {
        printf("slot %d not prepared\n",uVar13 & 0xffffffff);
      }
      else {
        local_160 = (Pipeline *)local_1e0._8_8_;
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_158,
                   PipeInputSlotNames[uVar13],0x10);
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_local_buf[0] = '\0';
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::
        __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
                  (&local_1b8,local_198,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(local_198._M_current + local_190),
                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_158,
                   (char *)local_1e0._0_8_,local_1e0._8_8_,0);
        std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_158);
        pPVar9 = local_160;
      }
      if ((pointer)local_1e0._0_8_ != (pointer)(local_1e0 + 0x10)) {
        operator_delete((void *)local_1e0._0_8_);
      }
      if (pPVar9 == (Pipeline *)0x0) goto LAB_0015500c;
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)this->ninputs);
  }
  if (this->noutputs < 1) {
LAB_00154f2c:
    b_00 = (CommandBlock *)operator_new(0x50);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_198._M_current,local_198._M_current + local_190);
    (b_00->super_Block)._vptr_Block = (_func_int **)&PTR__CommandBlock_0018dc78;
    (b_00->command)._M_dataplus._M_p = (pointer)&(b_00->command).field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&b_00->command,local_50,local_50 + local_48)
    ;
    b_00->process = (Process *)0x0;
    (b_00->consoleOutput)._M_dataplus._M_p = (pointer)&(b_00->consoleOutput).field_2;
    (b_00->consoleOutput)._M_string_length = 0;
    (b_00->consoleOutput).field_2._M_local_buf[0] = '\0';
    this->block = b_00;
    if (local_50 != local_40) {
      operator_delete(local_50);
      b_00 = this->block;
    }
    bVar10 = true;
    Pipeline::Add(&local_1c0->pipeline,&b_00->super_Block);
  }
  else {
    local_160 = &local_1c0->pipeline;
    uVar13 = 0;
    while( true ) {
      local_178 = (Connection **)0x0;
      iStack_170._M_current = (Connection **)0x0;
      local_168 = (Connection **)0x0;
      pCVar7 = (this->super_BaseNode).connections.
               super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar2 = (this->super_BaseNode).connections.
               super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pCVar7 == pCVar2) break;
      do {
        if (((VPPOperator *)pCVar7->output_node == this) &&
           (pCVar7->output_slot == PipeOutputSlotNames[uVar13])) {
          local_1e0._0_8_ = pCVar7;
          if (iStack_170._M_current == local_168) {
            std::vector<Connection*,std::allocator<Connection*>>::_M_realloc_insert<Connection*>
                      ((vector<Connection*,std::allocator<Connection*>> *)&local_178,iStack_170,
                       (Connection **)local_1e0);
          }
          else {
            *iStack_170._M_current = pCVar7;
            iStack_170._M_current = iStack_170._M_current + 1;
          }
        }
        pCVar7 = pCVar7 + 1;
      } while (pCVar7 != pCVar2);
      if (local_178 == iStack_170._M_current) break;
      local_1e0._8_8_ = (Pipeline *)0x0;
      local_1e0[0x10] = '\0';
      local_1e0._0_8_ = (pointer)(local_1e0 + 0x10);
      if ((long)iStack_170._M_current - (long)local_178 == 8) {
        pCVar3 = *local_178;
        RunContext::MakeOrGetFifo_abi_cxx11_
                  (&local_1b8,local_1c0,pCVar3->input_node,pCVar3->input_slot,pCVar3->output_node,
                   pCVar3->output_slot);
        std::__cxx11::string::operator=((string *)local_1e0,(string *)&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
      }
      else {
        RunContext::MakeFifo_abi_cxx11_(&local_1b8,local_1c0);
        local_78 = uVar13;
        std::__cxx11::string::_M_assign((string *)local_1e0);
        if ((long)iStack_170._M_current - (long)local_178 != 8) {
          uVar11 = 1;
          uVar13 = 0;
          do {
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_158,local_1b8._M_dataplus._M_p,
                       local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
            local_118 = local_108;
            local_110 = 0;
            local_108[0] = 0;
            uVar12 = (ulong)uVar11;
            if (((long)iStack_170._M_current - (long)local_178 >> 3) - 2U == uVar13) {
              pCVar3 = local_178[uVar12];
              RunContext::MakeOrGetFifo_abi_cxx11_
                        (&local_138,local_1c0,pCVar3->input_node,pCVar3->input_slot,
                         pCVar3->output_node,pCVar3->output_slot);
              std::__cxx11::string::operator=((string *)&local_118,(string *)&local_138);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p);
              }
            }
            else {
              RunContext::MakeFifo_abi_cxx11_(&local_138,local_1c0);
              std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_138);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p);
              }
              std::__cxx11::string::_M_assign((string *)&local_118);
            }
            pCVar3 = local_178[uVar13];
            RunContext::MakeOrGetFifo_abi_cxx11_
                      (&local_138,local_1c0,pCVar3->input_node,pCVar3->input_slot,
                       pCVar3->output_node,pCVar3->output_slot);
            b = (Block *)operator_new(0x50);
            std::operator+(&local_70,"vp dup ",&local_158);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
            local_d8 = &local_c8;
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_c8 = *plVar8;
              lStack_c0 = plVar6[3];
            }
            else {
              local_c8 = *plVar8;
              local_d8 = (long *)*plVar6;
            }
            local_d0 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_118);
            local_b8 = &local_a8;
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_a8 = *plVar8;
              lStack_a0 = plVar6[3];
            }
            else {
              local_a8 = *plVar8;
              local_b8 = (long *)*plVar6;
            }
            local_b0 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
            local_98 = &local_88;
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_88 = *plVar8;
              lStack_80 = plVar6[3];
            }
            else {
              local_88 = *plVar8;
              local_98 = (long *)*plVar6;
            }
            local_90 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_98,(ulong)local_138._M_dataplus._M_p);
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_e8 = *plVar8;
              uStack_e0 = (undefined4)plVar6[3];
              uStack_dc = *(undefined4 *)((long)plVar6 + 0x1c);
              local_f8 = &local_e8;
            }
            else {
              local_e8 = *plVar8;
              local_f8 = (long *)*plVar6;
            }
            local_f0 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            b->_vptr_Block = (_func_int **)&PTR__CommandBlock_0018dc78;
            b[1]._vptr_Block = (_func_int **)(b + 3);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(b + 1),local_f8,local_f0 + (long)local_f8);
            b[5]._vptr_Block = (_func_int **)0x0;
            b[6]._vptr_Block = (_func_int **)(b + 8);
            b[7]._vptr_Block = (_func_int **)0x0;
            *(undefined1 *)&b[8]._vptr_Block = 0;
            Pipeline::Add(local_160,b);
            if (local_f8 != &local_e8) {
              operator_delete(local_f8);
            }
            if (local_98 != &local_88) {
              operator_delete(local_98);
            }
            if (local_b8 != &local_a8) {
              operator_delete(local_b8);
            }
            if (local_d8 != &local_c8) {
              operator_delete(local_d8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
            if (local_118 != local_108) {
              operator_delete(local_118);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p);
            }
            uVar11 = uVar11 + 1;
            uVar13 = uVar12;
          } while (uVar12 < ((long)iStack_170._M_current - (long)local_178 >> 3) - 1U);
        }
        uVar13 = local_78;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
          uVar13 = local_78;
        }
      }
      uVar4 = local_1e0._8_8_;
      if ((Pipeline *)local_1e0._8_8_ == (Pipeline *)0x0) {
        printf("slot %d not prepared\n",uVar13 & 0xffffffff);
      }
      else {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_158,
                   PipeOutputSlotNames[uVar13],0x10);
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_local_buf[0] = '\0';
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::
        __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
                  (&local_1b8,local_198,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(local_198._M_current + local_190),
                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_158,
                   (char *)local_1e0._0_8_,local_1e0._8_8_,0);
        std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_158);
      }
      if ((pointer)local_1e0._0_8_ != (pointer)(local_1e0 + 0x10)) {
        operator_delete((void *)local_1e0._0_8_);
      }
      if (local_178 != (Connection **)0x0) {
        operator_delete(local_178);
      }
      if ((Pipeline *)uVar4 == (Pipeline *)0x0) goto LAB_0015500c;
      uVar13 = uVar13 + 1;
      if ((long)this->noutputs <= (long)uVar13) goto LAB_00154f2c;
    }
    printf("output slot %d not connected?\n",uVar13 & 0xffffffff);
    if (local_178 != (Connection **)0x0) {
      operator_delete(local_178);
    }
LAB_0015500c:
    bVar10 = false;
  }
LAB_0015500e:
  if (local_198._M_current != local_188) {
    operator_delete(local_198._M_current);
  }
  return bVar10;
}

Assistant:

virtual bool Prepare(RunContext& ctx) override
    {
        std::string command = this->command;
        for (int i = 0; i < ninputs; i++) {
            Connection* con = nullptr;
            for (auto& c : connections)
            {
                if (c.input_node != this || c.input_slot != PipeInputSlotNames[i])
                    continue;
                con = &c;
            }
            if (!con) {
                printf("input slot %d not connected?\n", i);
                return false;
            }
            const std::string& name = con->GetFifoName(ctx);
            if (name.empty()) {
                printf("slot %d not prepared\n", i);
                return false;
            }
            command = std::regex_replace(command, std::regex(PipeInputSlotNames[i]), name);
        }
        // TODO: duplicate output if multiple inputs use it
        for (int i = 0; i < noutputs; i++) {
            std::vector<Connection*> outputs;
            for (auto& c : connections)
            {
                if (c.output_node != this || c.output_slot != PipeOutputSlotNames[i])
                    continue;
                outputs.push_back(&c);
            }
            if (outputs.empty()) {
                printf("output slot %d not connected?\n", i);
                return false;
            }
            std::string fifoname;
            if (outputs.size() == 1)
            {
                fifoname = outputs[0]->GetFifoName(ctx);
            }
            else
            {
                // multiple outputs, so we need to duplicate the stream
                // XXX: this is vpp specific
                auto fifo = ctx.MakeFifo();
                fifoname = fifo;
                for (unsigned i = 0; i < outputs.size() - 1; i++)
                {
                    std::string from = fifo;
                    std::string to;
                    if (i == outputs.size() - 2)
                    {
                        to = outputs[i+1]->GetFifoName(ctx);
                    }
                    else
                    {
                        fifo = ctx.MakeFifo();
                        to = fifo;
                    }
                    std::string to2 = outputs[i]->GetFifoName(ctx);
                    ctx.CollectBlock(new CommandBlock("vp dup " + from + " " + to + " " + to2));
                }
            }
            if (fifoname.empty()) {
                printf("slot %d not prepared\n", i);
                return false;
            }
            command = std::regex_replace(command, std::regex(PipeOutputSlotNames[i]), fifoname);
        }

        block = new CommandBlock(command);
        ctx.CollectBlock(block);
        return true;
    }